

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O0

void update_skip(int *accu_rate,int64_t accu_dist,int *eob,int nz_num,int *nz_ci,int64_t rdmult,
                int skip_cost,int non_skip_cost,tran_low_t *qcoeff,tran_low_t *dqcoeff)

{
  int iVar1;
  int ci;
  int i;
  int64_t rd_new_eob;
  int64_t rd;
  int64_t rdmult_local;
  int *nz_ci_local;
  int nz_num_local;
  int *eob_local;
  int64_t accu_dist_local;
  int *accu_rate_local;
  
  if (skip_cost * rdmult + 0x100 >> 9 <
      ((*accu_rate + non_skip_cost) * rdmult + 0x100 >> 9) + accu_dist * 0x80) {
    for (i = 0; i < nz_num; i = i + 1) {
      iVar1 = nz_ci[i];
      qcoeff[iVar1] = 0;
      dqcoeff[iVar1] = 0;
    }
    *accu_rate = 0;
    *eob = 0;
  }
  return;
}

Assistant:

static inline void update_skip(int *accu_rate, int64_t accu_dist, int *eob,
                               int nz_num, int *nz_ci, int64_t rdmult,
                               int skip_cost, int non_skip_cost,
                               tran_low_t *qcoeff, tran_low_t *dqcoeff) {
  const int64_t rd = RDCOST(rdmult, *accu_rate + non_skip_cost, accu_dist);
  const int64_t rd_new_eob = RDCOST(rdmult, skip_cost, 0);
  if (rd_new_eob < rd) {
    for (int i = 0; i < nz_num; ++i) {
      const int ci = nz_ci[i];
      qcoeff[ci] = 0;
      dqcoeff[ci] = 0;
      // no need to set up levels because this is the last step
      // levels[get_padded_idx(ci, bhl)] = 0;
    }
    *accu_rate = 0;
    *eob = 0;
  }
}